

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_unitvect_pack_adaptproj(double *in,double *out)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = *in;
  dVar3 = ABS(dVar2);
  pdVar1 = in + 1;
  dVar4 = ABS(in[1]);
  dVar5 = in[2];
  dVar6 = dVar4;
  if (dVar4 <= dVar3) {
    dVar6 = dVar3;
  }
  if ((double)(~-(ulong)NAN(dVar3) & (ulong)dVar6 | -(ulong)NAN(dVar3) & (ulong)dVar4) <= ABS(dVar5)
     ) {
    in = in + 2;
    *out = dVar2;
  }
  else {
    dVar5 = (double)(~-(ulong)(dVar5 != 0.0) & 0x7ff0000000000000 |
                    (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
    if (dVar3 < dVar4) {
      *out = dVar2;
      in = pdVar1;
      goto LAB_001021fc;
    }
    *out = dVar5;
  }
  dVar5 = *pdVar1;
LAB_001021fc:
  out[1] = dVar5;
  out[2] = (double)((ulong)((uint)((ulong)*in >> 0x20) & 0x80000000) << 0x20 | (ulong)DAT_00109050);
  return;
}

Assistant:

MCPL_LOCAL void mcpl_unitvect_pack_adaptproj(const double* in, double* out) {

  //Precise packing of unit vector into 2 floats + 1 bit using the "Adaptive
  //Projection Packing" method (T. Kittelmann, 2017).
  //
  //The Adaptive Projection Packing method is a variant on the traditional projection
  //method where one would store (x,y,sign(z)) and upon unpacking recover the
  //magnitude of z with |z|=sqrt(1-x^2-y^2), a formula which suffers from
  //numerical precision issues when |z| is small. In this improved version, one
  //gets rid of the precision issues by always storing the components that are
  //smallest in magnitude (the last one must then have a magnitude in the
  //interval [1/sqrt(3),1] = [0.577,1.0] which is never small). This just leaves
  //the issue of being able to recognise the coordinate choices again upon
  //unpacking. Since all components are at most of unit magnitude, this is
  //achieved by storing 1/z rather than z and replacing either x or y as
  //needed (infinity when z=0). Thus, the packed data will contain:
  //
  //              ( 1/z,  y, sign(x) ) when |x|>|y|,|z|
  //              ( x,  1/z, sign(y) ) when |y|>|x|,|z|
  //              ( x,    y, sign(z) ) when |z|>|x|,|y|
  //
  //The unpacking code can determine which of the three scenarios is used to
  //encode a given piece of data by checking if the first or second field is
  //greater than unity.
  //
  //Note that the arrays "in" and "out" are both of dimension 3, however out[2]
  //will contain only binary information, in the form of the sign of the
  //component which was projected away (-1.0 or 1.0).
  const double absx = fabs(in[0]);
  const double absy = fabs(in[1]);
  if ( fabs(in[2]) < fmax(absx,absy) ) {
    const double invz = ( in[2] ? (1.0/in[2]) : INFINITY );
    if (absx>=absy) {
      //output (1/z,y,sign(x))
      out[0] = invz; out[1] = in[1]; out[2] = in[0];
    } else {
      //output (x,1/z,sign(y))
      out[0] = in[0]; out[1] = invz; out[2] = in[1];
    }
  } else {
    //output (x,y,sign(z))
    out[0] = in[0]; out[1] = in[1]; out[2] = in[2];
  }
  out[2] = copysign(1.0,out[2]);
}